

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int compare_tile_order(void *a,void *b)

{
  PackBSTileOrder *tile_b;
  PackBSTileOrder *tile_a;
  void *b_local;
  void *a_local;
  undefined4 local_4;
  
  if (*b < *a) {
    local_4 = -1;
  }
  else if (*a == *b) {
    local_4 = -1;
    if (*(ushort *)((long)b + 8) < *(ushort *)((long)a + 8)) {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int compare_tile_order(const void *a, const void *b) {
  const PackBSTileOrder *const tile_a = (const PackBSTileOrder *)a;
  const PackBSTileOrder *const tile_b = (const PackBSTileOrder *)b;

  if (tile_a->abs_sum_level > tile_b->abs_sum_level)
    return -1;
  else if (tile_a->abs_sum_level == tile_b->abs_sum_level)
    return (tile_a->tile_idx > tile_b->tile_idx ? 1 : -1);
  else
    return 1;
}